

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O1

InsertResult __thiscall
wasm::UnorderedFixedStorage<wasm::LocalSet_*,_2UL>::insert
          (UnorderedFixedStorage<wasm::LocalSet_*,_2UL> *this,LocalSet **x)

{
  ulong uVar1;
  ulong uVar2;
  LocalSet *pLVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used;
  bVar6 = uVar2 != 0;
  if (bVar6) {
    if ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[0] != *x) {
      uVar5 = 0;
      do {
        if (uVar2 - 1 == uVar5) goto LAB_00727e26;
        uVar1 = uVar5 + 1;
        lVar4 = uVar5 + 1;
        uVar5 = uVar1;
      } while ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[lVar4] != *x);
      bVar6 = uVar1 < uVar2;
    }
    if (bVar6) {
      return NoError;
    }
  }
LAB_00727e26:
  if (uVar2 < 3) {
    if (uVar2 != 2) {
      pLVar3 = *x;
      (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used = uVar2 + 1;
      (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar2] = pLVar3;
    }
    return (uint)(uVar2 == 2);
  }
  __assert_fail("this->used <= N",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                ,0x3e,
                "InsertResult wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>::insert(const T &) [T = wasm::LocalSet *, N = 2]"
               );
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }